

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnumeric.cpp
# Opt level: O0

quint64 qFloatDistance(double a,double b)

{
  double b_00;
  quint64 qVar1;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_stack_ffffffffffffffd8;
  double in_stack_ffffffffffffffe0;
  undefined8 local_10;
  undefined8 local_8;
  
  if ((in_XMM0_Qa != in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
    if (in_XMM0_Qa < 0.0 == in_XMM1_Qa < 0.0) {
      local_10 = in_XMM0_Qa;
      if (in_XMM0_Qa < 0.0) {
        local_10 = -in_XMM0_Qa;
        in_XMM1_Qa = -in_XMM1_Qa;
      }
      if ((local_10 != 0.0) || (NAN(local_10))) {
        if ((in_XMM1_Qa != 0.0) || (NAN(in_XMM1_Qa))) {
          if (local_10 <= in_XMM1_Qa) {
            local_8 = d2i(in_stack_ffffffffffffffd8);
            qVar1 = d2i(in_stack_ffffffffffffffd8);
            local_8 = local_8 - qVar1;
          }
          else {
            local_8 = d2i(in_stack_ffffffffffffffd8);
            qVar1 = d2i(in_stack_ffffffffffffffd8);
            local_8 = local_8 - qVar1;
          }
        }
        else {
          local_8 = d2i(in_stack_ffffffffffffffd8);
        }
      }
      else {
        local_8 = d2i(in_stack_ffffffffffffffd8);
      }
    }
    else {
      if (0.0 <= in_XMM0_Qa) {
        in_XMM1_Qa = -in_XMM1_Qa;
      }
      b_00 = (double)qFloatDistance(in_XMM1_Qa,in_stack_ffffffffffffffe0);
      local_8 = qFloatDistance(in_XMM1_Qa,b_00);
      local_8 = (long)b_00 + local_8;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

Q_CORE_EXPORT quint64 qFloatDistance(double a, double b)
{
    static const quint64 smallestPositiveFloatAsBits = 0x1;  // denormalized, (SMALLEST)
    /* Assumes:
       * IEE754 format double precision
       * Integers and floats have the same endian
    */
    static_assert(sizeof(quint64) == sizeof(double));
    Q_ASSERT(qIsFinite(a) && qIsFinite(b));
    if (a == b)
        return 0;
    if ((a < 0) != (b < 0)) {
        // if they have different signs
        if (a < 0)
            a = -a;
        else /*if (b < 0)*/
            b = -b;
        return qFloatDistance(0.0, a) + qFloatDistance(0.0, b);
    }
    if (a < 0) {
        a = -a;
        b = -b;
    }
    // at this point a and b should not be negative

    // 0 is special
    if (!a)
        return d2i(b) - smallestPositiveFloatAsBits + 1;
    if (!b)
        return d2i(a) - smallestPositiveFloatAsBits + 1;

    // finally do the common integer subtraction
    return a > b ? d2i(a) - d2i(b) : d2i(b) - d2i(a);
}